

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQBool sq_release(HSQUIRRELVM v,HSQOBJECT *po)

{
  uint *in_RSI;
  SQObject *in_stack_00000020;
  RefTable *in_stack_00000028;
  undefined8 local_8;
  
  if ((*in_RSI & 0x8000000) == 0) {
    local_8 = 1;
  }
  else {
    local_8 = RefTable::Release(in_stack_00000028,in_stack_00000020);
  }
  return local_8;
}

Assistant:

SQBool sq_release(HSQUIRRELVM v,HSQOBJECT *po)
{
    if(!ISREFCOUNTED(sq_type(*po))) return SQTrue;
#ifdef NO_GARBAGE_COLLECTOR
    bool ret = (po->_unVal.pRefCounted->_uiRef <= 1) ? SQTrue : SQFalse;
    __Release(po->_type,po->_unVal);
    return ret; //the ret val doesn't work(and cannot be fixed)
#else
    return _ss(v)->_refs_table.Release(*po);
#endif
}